

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O3

void __thiscall r_memory_map::advise(r_memory_map *this,void *addr,size_t length,int advice)

{
  uint uVar1;
  int iVar2;
  runtime_error *this_00;
  
  uVar1 = 3;
  if ((advice & 4U) == 0) {
    uVar1 = advice & 3;
  }
  iVar2 = madvise(addr,length,uVar1 | (uint)advice >> 1 & 4);
  if (iVar2 == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unable to apply memory mapping advice.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int r_memory_map::_get_posix_advice(int advice) const
{
    int posixAdvice = 0;

    if(advice & MM_ADVICE_RANDOM)
        posixAdvice |= MADV_RANDOM;
    if(advice & MM_ADVICE_SEQUENTIAL)
        posixAdvice |= MADV_SEQUENTIAL;
    if(advice & MM_ADVICE_WILLNEED)
        posixAdvice |= MADV_WILLNEED;
    if(advice & MM_ADVICE_DONTNEED)
        posixAdvice |= MADV_DONTNEED;

    return posixAdvice;
}